

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidDeConvolution3DOutputShape(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  Convolution3DLayerParams *pCVar15;
  unsigned_long *puVar16;
  WeightParams *pWVar17;
  float *pfVar18;
  ostream *poVar19;
  string *psVar20;
  long lVar21;
  undefined8 *puVar22;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar23;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar24;
  int iVar25;
  Arena *pAVar26;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001970d9:
    pRVar23 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar25 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar25) goto LAB_001970d9;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar25 + 1;
    pvVar14 = pRVar4->elements[iVar25];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar22);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar26);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar2] = 1;
  uVar24 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar24] = 3;
  uVar24 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar24] = 0x20;
  uVar24 = uVar2 + 3;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar24] = 100;
  uVar24 = uVar2 + 4;
  (pAVar9->shape_).current_size_ = uVar24;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar24 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar24] = 100;
  this->current_size_ = uVar2 + 5;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019729d:
    pRVar23 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar25 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar25) goto LAB_0019729d;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar25 + 1;
    pvVar14 = pRVar4->elements[iVar25];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"probs",puVar22);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar26);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar26 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar26);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197394:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar25 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar25) goto LAB_00197394;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar25 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar25];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001973cc:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar25 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar25) goto LAB_001973cc;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar25 + 1;
    pvVar14 = pRVar4->elements[iVar25];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019741c:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar25 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar25) goto LAB_0019741c;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar25 + 1;
    pvVar14 = pRVar4->elements[iVar25];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3b872d);
  if (pNVar12->_oneof_case_[0] != 0x5bf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x5bf;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pCVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(pAVar26);
    (pNVar12->layer_).convolution3d_ = pCVar15;
  }
  pCVar6 = (pNVar12->layer_).convolution_;
  *(undefined8 *)&pCVar6->field_0x3c = 0x100000003;
  (pCVar6->_stride_cached_byte_size_).super___atomic_base<int>._M_i = 3;
  *(undefined8 *)&(pCVar6->dilationfactor_).total_size_ = 0x300000003;
  *(undefined4 *)((long)&(pCVar6->dilationfactor_).arena_or_elements_ + 4) = 3;
  *(undefined8 *)&pCVar6->_dilationfactor_cached_byte_size_ = 0x100000001;
  (pCVar6->outputshape_).current_size_ = 1;
  (pCVar6->outputshape_).total_size_ = 1;
  (pCVar6->outputshape_).arena_or_elements_ = (void *)0x100000001;
  *(undefined8 *)&pCVar6->field_0x6c = 0;
  *(undefined8 *)((long)&pCVar6->weights_ + 4) = 0;
  pCVar6->bias_ = (WeightParams *)0x0;
  pCVar6->outputchannels_ = 0;
  *(undefined1 *)((long)&(pCVar6->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i + 1)
       = 1;
  uVar2 = (pCVar6->kernelsize_).current_size_;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar6->kernelsize_,uVar3 + 1);
  }
  puVar16 = google::protobuf::RepeatedField<unsigned_long>::elements(&pCVar6->kernelsize_);
  puVar16[uVar2] = 4;
  (pCVar6->kernelsize_).current_size_ = uVar2 + 1;
  *(undefined1 *)&(pCVar6->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i = 1;
  iVar25 = 0xf3;
  do {
    lVar21._0_4_ = (pCVar6->stride_).current_size_;
    lVar21._4_4_ = (pCVar6->stride_).total_size_;
    if (lVar21 == 0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar26 = *(Arena **)pAVar26;
      }
      pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar26);
      *(WeightParams **)&pCVar6->stride_ = pWVar17;
    }
    lVar21 = *(long *)&pCVar6->stride_;
    pRVar1 = (RepeatedField<float> *)(lVar21 + 0x10);
    uVar2 = *(uint *)(lVar21 + 0x10);
    if (uVar2 == *(uint *)(lVar21 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)(lVar21 + 0x14) + 1);
    }
    pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar18[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar25 = iVar25 + -1;
  } while (iVar25 != 0);
  iVar25 = 3;
  do {
    if ((pCVar6->stride_).arena_or_elements_ == (void *)0x0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar26 = *(Arena **)pAVar26;
      }
      pWVar17 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar26);
      (pCVar6->stride_).arena_or_elements_ = pWVar17;
    }
    pvVar14 = (pCVar6->stride_).arena_or_elements_;
    pRVar1 = (RepeatedField<float> *)((long)pvVar14 + 0x10);
    uVar2 = *(uint *)((long)pvVar14 + 0x10);
    if (uVar2 == *(uint *)((long)pvVar14 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)((long)pvVar14 + 0x14) + 1);
    }
    pfVar18 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar18[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar25 = iVar25 + -1;
  } while (iVar25 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  else {
    psVar20 = CoreML::Result::message_abi_cxx11_(&local_48);
    iVar25 = 0;
    lVar21 = std::__cxx11::string::find((char *)psVar20,0x3b87e1,0);
    if (lVar21 != -1) goto LAB_00197775;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,
               "res.message().find(\"if set, output shape must be of length 3\") != std::string::npos"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  }
  std::ostream::put((char)poVar19);
  iVar25 = 1;
  std::ostream::flush();
LAB_00197775:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return iVar25;
}

Assistant:

int testInvalidDeConvolution3DOutputShape() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);
    params->set_isdeconvolution(true);
    params->add_outputshape(4);
    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("if set, output shape must be of length 3") != std::string::npos);
    return 0;
}